

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xscript.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  __node_base_ptr *path;
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  command *pcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  int iVar6;
  pointer pbVar7;
  undefined1 local_a8 [8];
  syntax s;
  __node_base local_60 [2];
  size_type *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> source;
  
  pcVar4 = xscript::util::singleton<xscript::framework::command>::instance();
  xscript::framework::command::init(pcVar4,(EVP_PKEY_CTX *)(ulong)(uint)argc);
  xscript::parser::syntax::syntax((syntax *)local_a8);
  pcVar4 = xscript::util::singleton<xscript::framework::command>::instance();
  xscript::framework::command::get_source_files_abi_cxx11_(pcVar4);
  pcVar4 = xscript::util::singleton<xscript::framework::command>::instance();
  pvVar5 = xscript::framework::command::get_source_files_abi_cxx11_(pcVar4);
  pbVar7 = (pvVar5->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (pvVar5->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  iVar6 = 0;
  if (pbVar7 != pbVar1) {
    path = &s.packages._M_h._M_single_bucket;
    do {
      local_50 = &source._M_string_length;
      pcVar2 = (pbVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + pbVar7->_M_string_length);
      s.packages._M_h._M_single_bucket = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)path,local_50,source._M_dataplus._M_p + (long)local_50);
      bVar3 = xscript::parser::syntax::load((syntax *)local_a8,(string *)path);
      if (s.packages._M_h._M_single_bucket != local_60) {
        operator_delete(s.packages._M_h._M_single_bucket,
                        (ulong)((long)&(local_60[0]._M_nxt)->_M_nxt + 1));
      }
      if (!bVar3) {
        iVar6 = 1;
      }
      if (local_50 != &source._M_string_length) {
        operator_delete(local_50,source._M_string_length + 1);
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != pbVar1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<xscript::parser::ast,_std::default_delete<xscript::parser::ast>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<xscript::parser::ast,_std::default_delete<xscript::parser::ast>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<xscript::parser::ast,_std::default_delete<xscript::parser::ast>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<xscript::parser::ast,_std::default_delete<xscript::parser::ast>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_a8);
  return iVar6;
}

Assistant:

int main(int argc, char* argv[]) {

    command::instance().init(argc, argv);

    /*
    lgx_token_init();

    lgx_ast_t ast;
    int ast_ok = lgx_ast_init(&ast, argv[1]);
    lgx_ast_print(&ast);
    lgx_ast_print_error(&ast);

    if (ast_ok == 0) {
        lgx_compiler_t c;
        lgx_compiler_init(&c);
        int c_ok = lgx_compiler_generate(&c, &ast);

        lgx_bc_print(c.bc.buffer, c.bc.length);
        lgx_ast_print_error(&ast);
        lgx_const_print(&c.constant);
        printf("\n\n");

        if (c_ok == 0) {
            lgx_vm_t vm;
            lgx_vm_init(&vm, &c);

            // 寻找 main 函数
            lgx_str_t mainfunc = lgx_str("main");
            lgx_symbol_t* symbol = lgx_symbol_get(ast.root, &mainfunc, -1);

            if (symbol) {
                lgx_function_t* fun  = symbol->v.v.fun;
                lgx_vm_call(&vm, fun);
            } else {
                // TODO
                // can't find main func
            }

            lgx_vm_cleanup(&vm);
        }

        lgx_compiler_cleanup(&c);
    }

    lgx_ast_cleanup(&ast);

    lgx_token_cleanup();
    */

    int ret = 0;
    syntax s;
    
    if (command::instance().get_source_files().size() == 0) {
        // TODO 交互式终端模式
    }

    // 
    for (auto source : command::instance().get_source_files()) {
        if (!s.load(source)) {
            ret = 1;
        }
    }
    
    return ret;
}